

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
          (Expression *this,Expression *expr,SampledValueExprVisitor *visitor)

{
  logic_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  switch(expr->kind) {
  case Invalid:
    return;
  case IntegerLiteral:
    SampledValueExprVisitor::visit<slang::ast::IntegerLiteral>(visitor,(IntegerLiteral *)expr);
    return;
  case RealLiteral:
    SampledValueExprVisitor::visit<slang::ast::RealLiteral>(visitor,(RealLiteral *)expr);
    return;
  case TimeLiteral:
    SampledValueExprVisitor::visit<slang::ast::TimeLiteral>(visitor,(TimeLiteral *)expr);
    return;
  case UnbasedUnsizedIntegerLiteral:
    SampledValueExprVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
              (visitor,(UnbasedUnsizedIntegerLiteral *)expr);
    return;
  case NullLiteral:
    SampledValueExprVisitor::visit<slang::ast::NullLiteral>(visitor,(NullLiteral *)expr);
    return;
  case UnboundedLiteral:
    SampledValueExprVisitor::visit<slang::ast::UnboundedLiteral>(visitor,(UnboundedLiteral *)expr);
    return;
  case StringLiteral:
    SampledValueExprVisitor::visit<slang::ast::StringLiteral>(visitor,(StringLiteral *)expr);
    return;
  case NamedValue:
    SampledValueExprVisitor::visit<slang::ast::NamedValueExpression>
              (visitor,(NamedValueExpression *)expr);
    return;
  case HierarchicalValue:
    SampledValueExprVisitor::visit<slang::ast::HierarchicalValueExpression>
              (visitor,(HierarchicalValueExpression *)expr);
    return;
  case UnaryOp:
    SampledValueExprVisitor::visit<slang::ast::UnaryExpression>(visitor,(UnaryExpression *)expr);
    return;
  case BinaryOp:
    SampledValueExprVisitor::visit<slang::ast::BinaryExpression>(visitor,(BinaryExpression *)expr);
    return;
  case ConditionalOp:
    SampledValueExprVisitor::visit<slang::ast::ConditionalExpression>
              (visitor,(ConditionalExpression *)expr);
    return;
  case Inside:
    SampledValueExprVisitor::visit<slang::ast::InsideExpression>(visitor,(InsideExpression *)expr);
    return;
  case Assignment:
    SampledValueExprVisitor::visit<slang::ast::AssignmentExpression>
              (visitor,(AssignmentExpression *)expr);
    return;
  case Concatenation:
    SampledValueExprVisitor::visit<slang::ast::ConcatenationExpression>
              (visitor,(ConcatenationExpression *)expr);
    return;
  case Replication:
    SampledValueExprVisitor::visit<slang::ast::ReplicationExpression>
              (visitor,(ReplicationExpression *)expr);
    return;
  case Streaming:
    SampledValueExprVisitor::visit<slang::ast::StreamingConcatenationExpression>
              (visitor,(StreamingConcatenationExpression *)expr);
    return;
  case ElementSelect:
    SampledValueExprVisitor::visit<slang::ast::ElementSelectExpression>
              (visitor,(ElementSelectExpression *)expr);
    return;
  case RangeSelect:
    SampledValueExprVisitor::visit<slang::ast::RangeSelectExpression>
              (visitor,(RangeSelectExpression *)expr);
    return;
  case MemberAccess:
    SampledValueExprVisitor::visit<slang::ast::MemberAccessExpression>
              (visitor,(MemberAccessExpression *)expr);
    return;
  case Call:
    SampledValueExprVisitor::visit<slang::ast::CallExpression>(visitor,(CallExpression *)expr);
    return;
  case Conversion:
    SampledValueExprVisitor::visit<slang::ast::ConversionExpression>
              (visitor,(ConversionExpression *)expr);
    return;
  case DataType:
    SampledValueExprVisitor::visit<slang::ast::DataTypeExpression>
              (visitor,(DataTypeExpression *)expr);
    return;
  case TypeReference:
    SampledValueExprVisitor::visit<slang::ast::TypeReferenceExpression>
              (visitor,(TypeReferenceExpression *)expr);
    return;
  case HierarchicalReference:
    SampledValueExprVisitor::visit<slang::ast::HierarchicalReferenceExpression>
              (visitor,(HierarchicalReferenceExpression *)expr);
    return;
  case LValueReference:
    SampledValueExprVisitor::visit<slang::ast::LValueReferenceExpression>
              (visitor,(LValueReferenceExpression *)expr);
    return;
  case SimpleAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
              (visitor,(SimpleAssignmentPatternExpression *)expr);
    return;
  case StructuredAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
              (visitor,(StructuredAssignmentPatternExpression *)expr);
    return;
  case ReplicatedAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
              (visitor,(ReplicatedAssignmentPatternExpression *)expr);
    return;
  case EmptyArgument:
    SampledValueExprVisitor::visit<slang::ast::EmptyArgumentExpression>
              (visitor,(EmptyArgumentExpression *)expr);
    return;
  case OpenRange:
    SampledValueExprVisitor::visit<slang::ast::OpenRangeExpression>
              (visitor,(OpenRangeExpression *)expr);
    return;
  case Dist:
    SampledValueExprVisitor::visit<slang::ast::DistExpression>(visitor,(DistExpression *)expr);
    return;
  case NewArray:
    SampledValueExprVisitor::visit<slang::ast::NewArrayExpression>
              (visitor,(NewArrayExpression *)expr);
    return;
  case NewClass:
    SampledValueExprVisitor::visit<slang::ast::NewClassExpression>
              (visitor,(NewClassExpression *)expr);
    return;
  case NewCovergroup:
    SampledValueExprVisitor::visit<slang::ast::NewCovergroupExpression>
              (visitor,(NewCovergroupExpression *)expr);
    return;
  case CopyClass:
    SampledValueExprVisitor::visit<slang::ast::CopyClassExpression>
              (visitor,(CopyClassExpression *)expr);
    return;
  case MinTypMax:
    SampledValueExprVisitor::visit<slang::ast::MinTypMaxExpression>
              (visitor,(MinTypMaxExpression *)expr);
    return;
  case ClockingEvent:
    SampledValueExprVisitor::visit<slang::ast::ClockingEventExpression>
              (visitor,(ClockingEventExpression *)expr);
    return;
  case AssertionInstance:
    SampledValueExprVisitor::visit<slang::ast::AssertionInstanceExpression>
              (visitor,(AssertionInstanceExpression *)expr);
    return;
  case TaggedUnion:
    SampledValueExprVisitor::visit<slang::ast::TaggedUnionExpression>
              (visitor,(TaggedUnionExpression *)expr);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,"");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar2) {
    local_b0.field_2._M_allocated_capacity = *psVar2;
    local_b0.field_2._8_8_ = plVar1[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar2;
  }
  local_b0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x15b);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_f0 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}